

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::init(ClearCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  RenderContext *pRVar2;
  ContextInfo *pCVar3;
  NotSupportedError *pNVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  ClearCase *extraout_RAX;
  byte local_281;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  MessageBuilder local_200;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  byte local_11;
  ClearCase *pCStack_10;
  bool supportsES32;
  ClearCase *this_local;
  
  pCStack_10 = this;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  if (!(bool)local_11) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_primitive_bounding_box");
    if (!bVar1) {
      local_55 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_41);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
      local_55 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((this->m_drawTriangles & 1U) != 0) && ((local_11 & 1) == 0)) {
    pCVar3 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_EXT_tessellation_shader");
    if (!bVar1) {
      local_7a = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Test requires GL_EXT_tessellation_shader extension",&local_79)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_78);
      local_7a = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_200,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [15])"Doing multiple");
  local_208 = "";
  if ((this->m_scissoredClear & 1U) != 0) {
    local_208 = " scissored";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])" color buffer clears");
  local_210 = "";
  if ((this->m_drawTriangles & 1U) != 0) {
    local_210 = " and drawing some geometry between them";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xfb38cd);
  local_281 = 0;
  if ((this->m_scissoredClear & 1U) != 0) {
    local_281 = this->m_fullscreenScissor;
  }
  local_218 = "";
  if ((local_281 & 1) != 0) {
    local_218 = "Setting scissor area to cover entire viewport.\n";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_218);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [54])"Rendering with and without setting the bounding box.\n"
                     );
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [81])
                             "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
                     );
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])"Set bounding box using ");
  local_220 = "gl_BoundingBoxEXT output";
  if ((this->m_useGlobalState & 1U) != 0) {
    local_220 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_220);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xfb38cd);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [45])"Clear color is green with yellowish shades.\n");
  local_228 = "";
  if ((this->m_drawTriangles & 1U) != 0) {
    local_228 = "Primitive color is yellow with greenish shades.\n";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_228);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_200);
  if ((this->m_drawTriangles & 1U) != 0) {
    createVbo(this);
    createProgram(this);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void ClearCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_drawTriangles && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Doing multiple"
			<< ((m_scissoredClear) ? (" scissored") : (""))
			<< " color buffer clears"
			<< ((m_drawTriangles) ? (" and drawing some geometry between them") : (""))
			<< ".\n"
		<< ((m_scissoredClear && m_fullscreenScissor) ? ("Setting scissor area to cover entire viewport.\n") : (""))
		<< "Rendering with and without setting the bounding box.\n"
		<< "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< ".\n"
		<< "Clear color is green with yellowish shades.\n"
		<< ((m_drawTriangles) ? ("Primitive color is yellow with greenish shades.\n") : (""))
		<< tcu::TestLog::EndMessage;

	if (m_drawTriangles)
	{
		createVbo();
		createProgram();
	}
}